

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<bool>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<bool> *this,TypedAttributeWithFallback<bool> *param_1)

{
  bool bVar1;
  TypedAttributeWithFallback<bool> *param_1_local;
  TypedAttributeWithFallback<bool> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas,&param_1->_metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&this->_paths,&param_1->_paths);
  nonstd::optional_lite::optional<bool>::optional(&this->_attrib,&param_1->_attrib);
  bVar1 = param_1->_fallback;
  this->_empty = param_1->_empty;
  this->_fallback = bVar1;
  this->_blocked = param_1->_blocked;
  return;
}

Assistant:

static uint32_t type_id() { return value::TypeTraits<T>::type_id(); }